

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O2

void __thiscall
draco::OctahedronToolBox::CanonicalizeIntegerVector<int>(OctahedronToolBox *this,int *vec)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = *vec;
  iVar4 = -iVar6;
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  iVar3 = vec[1];
  iVar5 = -iVar3;
  if (0 < iVar3) {
    iVar5 = iVar3;
  }
  uVar1 = vec[2];
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  lVar7 = (ulong)uVar2 + (ulong)(uint)(iVar5 + iVar4);
  if (lVar7 != 0) {
    iVar4 = (int)(((long)this->center_value_ * (long)iVar6) / lVar7);
    *vec = iVar4;
    iVar6 = -iVar4;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    iVar3 = (int)(((long)this->center_value_ * (long)iVar3) / lVar7);
    iVar4 = -iVar3;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    vec[1] = iVar3;
    if (-1 < (int)uVar1) {
      vec[2] = this->center_value_ - (iVar4 + iVar6);
      return;
    }
    vec[2] = (iVar4 + iVar6) - this->center_value_;
    return;
  }
  *vec = this->center_value_;
  return;
}

Assistant:

void CanonicalizeIntegerVector(T *vec) const {
    static_assert(std::is_integral<T>::value, "T must be an integral type.");
    static_assert(std::is_signed<T>::value, "T must be a signed type.");
    const int64_t abs_sum = static_cast<int64_t>(std::abs(vec[0])) +
                            static_cast<int64_t>(std::abs(vec[1])) +
                            static_cast<int64_t>(std::abs(vec[2]));

    if (abs_sum == 0) {
      vec[0] = center_value_;  // vec[1] == v[2] == 0
    } else {
      vec[0] =
          (static_cast<int64_t>(vec[0]) * static_cast<int64_t>(center_value_)) /
          abs_sum;
      vec[1] =
          (static_cast<int64_t>(vec[1]) * static_cast<int64_t>(center_value_)) /
          abs_sum;
      if (vec[2] >= 0) {
        vec[2] = center_value_ - std::abs(vec[0]) - std::abs(vec[1]);
      } else {
        vec[2] = -(center_value_ - std::abs(vec[0]) - std::abs(vec[1]));
      }
    }
  }